

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O2

void add_to_hit(artifact *art,wchar_t fixed,wchar_t random)

{
  uint32_t uVar1;
  uint uVar2;
  char *fmt;
  
  if (art->to_h < 0x1b) {
    if (0x10 < art->to_h) {
      uVar1 = 2;
      goto LAB_00191617;
    }
  }
  else {
    uVar1 = 6;
LAB_00191617:
    uVar1 = Rand_div(uVar1);
    if (uVar1 != 0) {
      uVar2 = art->to_h;
      fmt = "Failed to add to-hit, value %d is too high\n";
      goto LAB_00191654;
    }
  }
  uVar1 = Rand_div(fixed);
  uVar2 = (int)(short)((short)uVar1 + 1) + art->to_h;
  art->to_h = uVar2;
  fmt = "Adding ability: extra to_h (now %+d)\n";
LAB_00191654:
  file_putf(log_file,fmt,(ulong)uVar2);
  return;
}

Assistant:

static void add_to_hit(struct artifact *art, int fixed, int random)
{
	/* Inhibit above certain threshholds */
	if (art->to_h > VERYHIGH_TO_HIT) {
		if (!INHIBIT_STRONG) {
			file_putf(log_file, "Failed to add to-hit, value %d is too high\n",
					  art->to_h);
			return;
		}
	} else if (art->to_h > HIGH_TO_HIT) {
		if (!INHIBIT_WEAK) {
			file_putf(log_file, "Failed to add to-hit, value %d is too high\n",
					  art->to_h);
			return;
		}
	}
	art->to_h += (int16_t)(fixed + randint0(random));
	file_putf(log_file, "Adding ability: extra to_h (now %+d)\n", art->to_h);
}